

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cpp
# Opt level: O2

ostream * miniros::operator<<(ostream *os,SteadyTime *rhs)

{
  ostream *poVar1;
  IosFlagSaver s;
  
  IosFlagSaver::IosFlagSaver(&s,os);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  poVar1 = std::operator<<(poVar1,".");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 9;
  poVar1 = std::operator<<(poVar1,0x30);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  IosFlagSaver::~IosFlagSaver(&s);
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream& os, const SteadyTime &rhs)
  {
	IosFlagSaver s(os);
    os << rhs.sec << "." << std::setw(9) << std::setfill('0') << rhs.nsec;
    return os;
  }